

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkAllocationCallbackUtil.cpp
# Opt level: O2

bool vk::checkAndLog(TestLog *log,AllocationCallbackValidationResults *results,
                    deUint32 allowedLiveAllocScopeBits)

{
  ostringstream *poVar1;
  int iVar2;
  pointer pAVar3;
  pointer pAVar4;
  uint uVar5;
  pointer pAVar6;
  long lVar7;
  size_t liveNdx;
  ulong uVar8;
  long lVar9;
  int scopeNdx;
  long lVar10;
  MessageBuilder local_1b0;
  
  pAVar6 = (results->violations).
           super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pAVar4 = (results->violations).
           super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pAVar6 != pAVar4) {
    poVar1 = &local_1b0.m_str;
    lVar10 = 0;
    for (lVar9 = 1; lVar9 - 1U < (ulong)(((long)pAVar4 - (long)pAVar6) / 0x38); lVar9 = lVar9 + 1) {
      local_1b0.m_log = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"VIOLATION ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<((ostream *)poVar1,": ");
      operator<<((ostream *)poVar1,
                 (AllocationCallbackViolation *)
                 ((long)&(((results->violations).
                           super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
                           ._M_impl.super__Vector_impl_data._M_start)->record).type + lVar10));
      std::operator<<((ostream *)poVar1," (");
      operator<<((ostream *)poVar1,
                 (AllocationCallbackRecord *)
                 ((long)&(((results->violations).
                           super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
                           ._M_impl.super__Vector_impl_data._M_start)->record).type + lVar10));
      std::operator<<((ostream *)poVar1,")");
      tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      pAVar6 = (results->violations).
               super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pAVar4 = (results->violations).
               super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar10 = lVar10 + 0x38;
    }
    poVar1 = &local_1b0.m_str;
    local_1b0.m_log = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"ERROR: Found ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<((ostream *)poVar1," invalid allocation callbacks!");
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  }
  poVar1 = &local_1b0.m_str;
  lVar9 = 0;
  lVar10 = 0;
  uVar8 = 0;
  do {
    lVar7 = 0x18;
    pAVar3 = (results->liveAllocations).
             super__Vector_base<vk::AllocationCallbackRecord,_std::allocator<vk::AllocationCallbackRecord>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(results->liveAllocations).
                       super__Vector_base<vk::AllocationCallbackRecord,_std::allocator<vk::AllocationCallbackRecord>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar3) / 0x30) <= uVar8)
    {
      poVar1 = &local_1b0.m_str;
      for (lVar9 = 0; lVar9 != 5; lVar9 = lVar9 + 1) {
        if (results->internalAllocationTotal[0][lVar9] != 0 &&
            (allowedLiveAllocScopeBits >> ((uint)lVar9 & 0x1f) & 1) == 0) {
          local_1b0.m_log = log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
          std::operator<<((ostream *)poVar1,"LEAK ");
          lVar10 = lVar10 + 1;
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::operator<<((ostream *)poVar1,": ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::operator<<((ostream *)poVar1," bytes of (");
          std::ostream::operator<<(poVar1,0);
          std::operator<<((ostream *)poVar1,", ");
          std::ostream::operator<<(poVar1,(uint)lVar9);
          std::operator<<((ostream *)poVar1,") internal memory is still allocated");
          tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
        }
      }
      if (lVar10 != 0) {
        poVar1 = &local_1b0.m_str;
        local_1b0.m_log = log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
        std::operator<<((ostream *)poVar1,"ERROR: Found ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<((ostream *)poVar1," memory leaks!");
        tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      }
      return lVar10 == 0 &&
             (results->violations).
             super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             (results->violations).
             super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    }
    iVar2 = *(int *)((long)&pAVar3->type + lVar9);
    if (iVar2 == 0) {
LAB_008c7e33:
      uVar5 = *(uint *)((long)&pAVar3->type + lVar9 + lVar7);
    }
    else {
      uVar5 = 5;
      if (iVar2 == 1) {
        lVar7 = 0x20;
        goto LAB_008c7e33;
      }
    }
    if ((allowedLiveAllocScopeBits >> (uVar5 & 0x1f) & 1) == 0) {
      local_1b0.m_log = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"LEAK ");
      lVar10 = lVar10 + 1;
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<((ostream *)poVar1,": ");
      operator<<((ostream *)poVar1,(AllocationCallbackRecord *)((long)&pAVar3->type + lVar9));
      tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    }
    uVar8 = uVar8 + 1;
    lVar9 = lVar9 + 0x30;
  } while( true );
}

Assistant:

bool checkAndLog (tcu::TestLog& log, const AllocationCallbackValidationResults& results, deUint32 allowedLiveAllocScopeBits)
{
	using tcu::TestLog;

	size_t	numLeaks	= 0;

	if (!results.violations.empty())
	{
		for (size_t violationNdx = 0; violationNdx < results.violations.size(); ++violationNdx)
		{
			log << TestLog::Message << "VIOLATION " << (violationNdx+1)
													<< ": " << results.violations[violationNdx]
													<< " (" << results.violations[violationNdx].record << ")"
				<< TestLog::EndMessage;
		}

		log << TestLog::Message << "ERROR: Found " << results.violations.size() << " invalid allocation callbacks!" << TestLog::EndMessage;
	}

	// Verify live allocations
	for (size_t liveNdx = 0; liveNdx < results.liveAllocations.size(); ++liveNdx)
	{
		const AllocationCallbackRecord&		record	= results.liveAllocations[liveNdx];
		const VkSystemAllocationScope		scope	= record.type == AllocationCallbackRecord::TYPE_ALLOCATION		? record.data.allocation.scope
													: record.type == AllocationCallbackRecord::TYPE_REALLOCATION	? record.data.reallocation.scope
													: VK_SYSTEM_ALLOCATION_SCOPE_LAST;

		DE_ASSERT(de::inBounds(scope, (VkSystemAllocationScope)0, VK_SYSTEM_ALLOCATION_SCOPE_LAST));

		if ((allowedLiveAllocScopeBits & (1u << scope)) == 0)
		{
			log << TestLog::Message << "LEAK " << (numLeaks+1) << ": " << record << TestLog::EndMessage;
			numLeaks += 1;
		}
	}

	// Verify internal allocations
	for (int internalAllocTypeNdx = 0; internalAllocTypeNdx < VK_INTERNAL_ALLOCATION_TYPE_LAST; ++internalAllocTypeNdx)
	{
		for (int scopeNdx = 0; scopeNdx < VK_SYSTEM_ALLOCATION_SCOPE_LAST; ++scopeNdx)
		{
			const VkInternalAllocationType	type			= (VkInternalAllocationType)internalAllocTypeNdx;
			const VkSystemAllocationScope	scope			= (VkSystemAllocationScope)scopeNdx;
			const size_t					totalAllocated	= results.internalAllocationTotal[type][scope];

			if ((allowedLiveAllocScopeBits & (1u << scopeNdx)) == 0 &&
				totalAllocated > 0)
			{
				log << TestLog::Message << "LEAK " << (numLeaks+1) << ": " << totalAllocated
										<< " bytes of (" << type << ", " << scope << ") internal memory is still allocated"
					<< TestLog::EndMessage;
				numLeaks += 1;
			}
		}
	}

	if (numLeaks > 0)
		log << TestLog::Message << "ERROR: Found " << numLeaks << " memory leaks!" << TestLog::EndMessage;

	return results.violations.empty() && numLeaks == 0;
}